

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall CNode::MarkReceivedMsgsForProcessing(CNode *this)

{
  long lVar1;
  bool bVar2;
  int __fdout;
  AnnotatedMixin<std::mutex> *in_RDI;
  __off64_t *__offout;
  size_t __len;
  long in_FS_OFFSET;
  CNetMessage *msg;
  list<CNetMessage,_std::allocator<CNetMessage>_> *__range1;
  size_t nSizeAdded;
  iterator __end1;
  iterator __begin1;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock102;
  uint in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  list<CNetMessage,_std::allocator<CNetMessage>_> *in_stack_ffffffffffffff90;
  AnnotatedMixin<std::mutex> *pAVar3;
  _Self *in_stack_ffffffffffffff98;
  reference in_stack_ffffffffffffffa8;
  char *pszFile;
  char *pszName;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffffc8;
  int local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pAVar3 = in_RDI;
  AssertLockNotHeldInline
            ((char *)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff8c,(Mutex *)0x211fb4);
  pszName = (char *)0x0;
  pszFile = (char *)((long)&in_RDI[0x10].super_mutex.super___mutex_base._M_mutex + 0x10);
  std::__cxx11::list<CNetMessage,_std::allocator<CNetMessage>_>::begin(in_stack_ffffffffffffff90);
  std::__cxx11::list<CNetMessage,_std::allocator<CNetMessage>_>::end(in_stack_ffffffffffffff90);
  while( true ) {
    bVar2 = std::operator==(in_stack_ffffffffffffff98,(_Self *)in_stack_ffffffffffffff90);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffa8 =
         std::_List_iterator<CNetMessage>::operator*
                   ((_List_iterator<CNetMessage> *)
                    CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    pszName = pszName + in_stack_ffffffffffffffa8->m_raw_message_size;
    std::_List_iterator<CNetMessage>::operator++
              ((_List_iterator<CNetMessage> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  }
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  __fdout = 0x10d4285;
  __offout = (__off64_t *)0xee5;
  __len = 0;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffffc8,pAVar3,pszName,pszFile,
             (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x18,0));
  pAVar3 = in_RDI + 0x12;
  std::__cxx11::list<CNetMessage,_std::allocator<CNetMessage>_>::end
            ((list<CNetMessage,_std::allocator<CNetMessage>_> *)pAVar3);
  std::_List_const_iterator<CNetMessage>::_List_const_iterator
            ((_List_const_iterator<CNetMessage> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),(iterator *)0x212093);
  std::__cxx11::list<CNetMessage,_std::allocator<CNetMessage>_>::splice
            ((list<CNetMessage,_std::allocator<CNetMessage>_> *)pAVar3,local_30,
             (__off64_t *)&in_RDI[0x10].super_mutex.super___mutex_base._M_mutex.__data.__kind,
             __fdout,__offout,__len,in_stack_ffffffffffffff88);
  in_RDI[0x12].super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)
       (pszName + *(long *)((long)&in_RDI[0x12].super_mutex.super___mutex_base._M_mutex + 0x18));
  std::atomic<bool>::operator=
            ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),false);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CNode::MarkReceivedMsgsForProcessing()
{
    AssertLockNotHeld(m_msg_process_queue_mutex);

    size_t nSizeAdded = 0;
    for (const auto& msg : vRecvMsg) {
        // vRecvMsg contains only completed CNetMessage
        // the single possible partially deserialized message are held by TransportDeserializer
        nSizeAdded += msg.m_raw_message_size;
    }

    LOCK(m_msg_process_queue_mutex);
    m_msg_process_queue.splice(m_msg_process_queue.end(), vRecvMsg);
    m_msg_process_queue_size += nSizeAdded;
    fPauseRecv = m_msg_process_queue_size > m_recv_flood_size;
}